

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_polynomial_model.hpp
# Opt level: O1

vector<unsigned_long,_std::allocator<unsigned_long>_> * __thiscall
cimod::BinaryPolynomialModel<unsigned_long,_double>::GenerateSortedVariables
          (vector<unsigned_long,_std::allocator<unsigned_long>_> *__return_storage_ptr__,
          BinaryPolynomialModel<unsigned_long,_double> *this)

{
  pointer puVar1;
  pointer puVar2;
  long lVar3;
  ulong uVar4;
  allocator_type local_19;
  
  std::vector<unsigned_long,std::allocator<unsigned_long>>::
  vector<std::__detail::_Node_const_iterator<unsigned_long,true,false>,void>
            ((vector<unsigned_long,std::allocator<unsigned_long>> *)__return_storage_ptr__,
             (_Node_const_iterator<unsigned_long,_true,_false>)
             (this->variables_)._M_h._M_before_begin._M_nxt,
             (_Node_const_iterator<unsigned_long,_true,_false>)0x0,&local_19);
  puVar1 = (__return_storage_ptr__->
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = (__return_storage_ptr__->
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (puVar1 != puVar2) {
    uVar4 = (long)puVar2 - (long)puVar1 >> 3;
    lVar3 = 0x3f;
    if (uVar4 != 0) {
      for (; uVar4 >> lVar3 == 0; lVar3 = lVar3 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (puVar1,puVar2,((uint)lVar3 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (puVar1,puVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<IndexType> GenerateSortedVariables() const {
      std::vector<IndexType> sorted_variables( variables_.begin(), variables_.end() );
      std::sort( sorted_variables.begin(), sorted_variables.end() );
      return sorted_variables;
    }